

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O3

void __thiscall TrivialRETest_Compilations_Test::TestBody(TrivialRETest_Compilations_Test *this)

{
  pointer *this_00;
  size_t sVar1;
  string_view str;
  char *message;
  undefined1 auVar2 [8];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1f8;
  undefined8 local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined8 local_188;
  char *local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168;
  char *local_160;
  undefined8 local_158;
  char *local_150;
  undefined8 local_148;
  char *local_140;
  undefined8 local_138;
  char *local_130;
  undefined8 local_128;
  char *local_120;
  undefined8 local_118;
  char *local_110;
  undefined8 local_108;
  char *local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  cases;
  undefined1 local_78 [8];
  string got;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  local_1f8.first._M_len._0_4_ = 0x15;
  local_1f8.first._M_len._4_4_ = 0;
  local_1f8.first._M_str = "mis.*being deal.*free";
  local_1f8.second._M_len = 0x39;
  local_1f8.second._M_str = "(seq \'mis\' (star <dot>) \'being deal\' (star <dot>) \'free\')";
  local_1d8 = 0x17;
  local_1d0 = "mis.*(being|deal).*free";
  local_1c8 = 0x41;
  local_1c0 = "(seq \'mis\' (star <dot>) (alt \'being\' \'deal\') (star <dot>) \'free\')";
  local_1b8 = 0x17;
  local_1b0 = "mis.*(being|deal)*fre*e";
  local_1a8 = 0x48;
  local_1a0 = "(seq \'mis\' (star <dot>) (star (alt \'being\' \'deal\')) \'fr\' (star \'e\') \'e\')"
  ;
  local_198 = 0x17;
  local_190 = "mis.*(being|deal)+?free";
  local_188 = 0x56;
  local_180 = 
  "(seq \'mis\' (star <dot>) (seq (alt \'being\' \'deal\') (star (alt \'being\' \'deal\'))) \'free\')"
  ;
  local_178 = 0x17;
  local_170 = "mis.*(being|deal)?fre*e";
  local_168 = 0x47;
  local_160 = "(seq \'mis\' (star <dot>) (alt <any> \'being\' \'deal\') \'fr\' (star \'e\') \'e\')";
  local_158 = 0x15;
  local_150 = "mis.*being|deal.*free";
  local_148 = 0x47;
  local_140 = "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))";
  local_138 = 0x16;
  local_130 = "mis.*?being|deal.*free";
  local_128 = 0x47;
  local_120 = "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))";
  local_118 = 2;
  local_110 = "\\*";
  local_108 = 3;
  local_100 = "\'*\'";
  local_f8 = 2;
  local_f0 = "\\|";
  local_e8 = 3;
  local_e0 = "\'|\'";
  local_d8 = 1;
  local_d0 = "|";
  local_c8 = 0x11;
  local_c0 = "(alt <any> <any>)";
  local_b8 = 4;
  local_b0 = "(|)|";
  local_a8 = 0x1d;
  local_a0 = "(alt (alt <any> <any>) <any>)";
  __l._M_len = 0xb;
  __l._M_array = &local_1f8;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)local_98,__l,(allocator_type *)local_78);
  puts("--- test cases ---");
  if (local_98 !=
      (undefined1  [8])
      cases.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar2 = local_98;
    do {
      sVar1 = (((pointer)auVar2)->first)._M_len;
      local_1f8.first._M_str = (((pointer)auVar2)->first)._M_str;
      str._M_len = (((pointer)auVar2)->first)._M_len;
      str._M_str = (((pointer)auVar2)->first)._M_str;
      local_1f8.second._M_len = (((pointer)auVar2)->second)._M_len;
      local_1f8.second._M_str = (((pointer)auVar2)->second)._M_str;
      local_1f8.first._M_len._0_4_ = (uint)sVar1;
      local_1f8.first._M_len._4_4_ = (undefined4)(sVar1 >> 0x20);
      got.field_2._8_8_ = 0;
      pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48 = &local_38;
      trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
      CompileOrDie_abi_cxx11_
                ((Matcher *)local_78,
                 (C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)
                 (got.field_2._M_local_buf + 8),str);
      printf("test: /%.*s/ -> %s\n",(ulong)(uint)local_1f8.first._M_len,local_1f8.first._M_str,
             local_78);
      testing::internal::
      CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                ((internal *)(got.field_2._M_local_buf + 8),"expected","got",&local_1f8.second,
                 (Matcher *)local_78);
      if (got.field_2._M_local_buf[8] == '\0') {
        testing::Message::Message((Message *)&local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_38._M_head_impl + 0x10),"re: ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_38._M_head_impl + 0x10),local_1f8.first._M_str,
                   CONCAT44(local_1f8.first._M_len._4_4_,(uint)local_1f8.first._M_len));
        message = "";
        if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          message = (pbStack_50->_M_dataplus)._M_p;
        }
        this_00 = &cases.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                   ,0x6e,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_50,pbStack_50);
      }
      if (local_78 != (undefined1  [8])&got._M_string_length) {
        operator_delete((void *)local_78,got._M_string_length + 1);
      }
      auVar2 = (undefined1  [8])((long)auVar2 + 0x20);
    } while (auVar2 != (undefined1  [8])
                       cases.
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_98,
                    (long)cases.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_98);
  }
  return;
}

Assistant:

TEST(TrivialRETest, Compilations) {
  // format is {regex, golden-parsing}
  std::vector<std::pair<std::string_view, std::string_view>> cases = {
      {"mis.*being deal.*free", "(seq 'mis' (star <dot>) 'being deal' (star <dot>) 'free')"},
      {"mis.*(being|deal).*free", "(seq 'mis' (star <dot>) (alt 'being' 'deal') (star <dot>) 'free')"},
      {"mis.*(being|deal)*fre*e", "(seq 'mis' (star <dot>) (star (alt 'being' 'deal')) 'fr' (star 'e') 'e')"},
      {"mis.*(being|deal)+?free", "(seq 'mis' (star <dot>) (seq (alt 'being' 'deal') (star (alt 'being' 'deal'))) 'free')"},
      {"mis.*(being|deal)?fre*e", "(seq 'mis' (star <dot>) (alt <any> 'being' 'deal') 'fr' (star 'e') 'e')"},
      {"mis.*being|deal.*free",
       "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) "
       "'free'))"},
      {"mis.*?being|deal.*free", "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) 'free'))"},
      {"\\*", "'*'"},
      {"\\|", "'|'"},
      {"|", "(alt <any> <any>)"},
      {"(|)|", "(alt (alt <any> <any>) <any>)"},
  };

  printf("--- test cases ---\n");
  for (auto [re, expected] : cases) {
    std::string got = trivialre::re_compiler::C<StringTestingBuilder>{StringTestingBuilder{}}.CompileOrDie(re);
    printf("test: /%.*s/ -> %s\n", int(re.size()), re.data(), got.c_str());
    EXPECT_EQ(expected, got) << "re: " << re;
  }
}